

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_malloc.h
# Opt level: O0

void __thiscall
vector_malloc_counter_clear<unsigned_long,_16U>::grow
          (vector_malloc_counter_clear<unsigned_long,_16U> *this)

{
  unsigned_long *puVar1;
  unsigned_long *t;
  vector_malloc_counter_clear<unsigned_long,_16U> *this_local;
  
  if (this->_capacity == 0) {
    this->_capacity = 0x10;
    puVar1 = (unsigned_long *)malloc(this->_capacity << 3);
    this->_data = puVar1;
  }
  else {
    this->_capacity = this->_capacity << 1;
    puVar1 = (unsigned_long *)malloc(this->_capacity << 3);
    memcpy(puVar1,this->_data,this->_size << 3);
    free(this->_data);
    this->_data = puVar1;
  }
  return;
}

Assistant:

void grow()
	{
		if (_capacity == 0) {
			_capacity = InitialSize;
			_data = static_cast<T*>(malloc(_capacity*sizeof(T)));
		} else {
			_capacity <<= 1;
			T* t = static_cast<T*>(malloc(_capacity*sizeof(T)));
			(void) memcpy(t, _data, _size*sizeof(T));
			free(_data);
			_data = t;
		}
	}